

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O0

void anon_unknown.dwarf_1421bc::Fshifter_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *peVar1;
  uint in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  
  if (in_ESI != 1) {
    peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (peVar1,0xa002,"Invalid frequency shifter float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  if ((0.0 <= in_XMM0_Da) && (in_XMM0_Da <= 24000.0)) {
    *in_RDI = in_XMM0_Da;
    return;
  }
  peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception(peVar1,0xa003,"Frequency shifter frequency out of range");
  __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
}

Assistant:

void Fshifter_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_FREQUENCY:
        if(!(val >= AL_FREQUENCY_SHIFTER_MIN_FREQUENCY && val <= AL_FREQUENCY_SHIFTER_MAX_FREQUENCY))
            throw effect_exception{AL_INVALID_VALUE, "Frequency shifter frequency out of range"};
        props->Fshifter.Frequency = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid frequency shifter float property 0x%04x",
            param};
    }
}